

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O3

string * __thiscall
embree::XMLLoader::load<std::__cxx11::string>
          (string *__return_storage_ptr__,XMLLoader *this,Ref<embree::XML> *xml)

{
  Token *this_00;
  runtime_error *this_01;
  long *plVar1;
  long *plVar2;
  long *local_60;
  long local_58;
  long local_50;
  long lStack_48;
  string local_40;
  
  this_00 = (xml->ptr->body).super__Vector_base<embree::Token,_std::allocator<embree::Token>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((xml->ptr->body).super__Vector_base<embree::Token,_std::allocator<embree::Token>_>._M_impl.
      super__Vector_impl_data._M_finish != this_00) {
    Token::String_abi_cxx11_(__return_storage_ptr__,this_00);
    return __return_storage_ptr__;
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  ParseLocation::str_abi_cxx11_(&local_40,&xml->ptr->loc);
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_40);
  local_60 = (long *)*plVar1;
  plVar2 = plVar1 + 2;
  if (local_60 == plVar2) {
    local_50 = *plVar2;
    lStack_48 = plVar1[3];
    local_60 = &local_50;
  }
  else {
    local_50 = *plVar2;
  }
  local_58 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  std::runtime_error::runtime_error(this_01,(string *)&local_60);
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Vec3f getVec3fa() const { return Vec3fa(f[0],f[1],f[2]); }